

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::ProcessEvaluationFiles
          (cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *generatedFiles)

{
  long lVar1;
  pointer ppcVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  ulong uVar6;
  pointer ppcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  intersection;
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  cmLocalGenerator *local_70;
  string local_68;
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  local_48;
  
  local_70 = this;
  cmMakefile::GetEvaluationFiles(&local_48,this->Makefile);
  if (local_48.
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppcVar2 = local_48.
              super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      ppcVar7 = ppcVar2 + 1;
      cmGeneratorExpressionEvaluationFile::Generate(*ppcVar2,local_70);
      if ((cmSystemTools::s_FatalErrorOccured != false) ||
         (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c0,&(*ppcVar2)->Files);
      pbVar4 = local_c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar6 = (long)local_c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar1 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_c0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_c0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pbVar3,pbVar4);
      }
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      __set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (generatedFiles->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (generatedFiles->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,&local_88);
      pbVar4 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   generatedFiles,
                   (generatedFiles->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   local_c0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_c0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::
        __inplace_merge<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((generatedFiles->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   ((long)local_c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                   (long)local_c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) +
                   (long)(generatedFiles->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8," ","");
        cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_68,'\"',&local_88,'\"',&local_a8);
        cmSystemTools::Error
                  ("Files to be generated by multiple different commands: ",
                   local_68._M_dataplus._M_p,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      if ((pbVar3 != pbVar4) ||
         (ppcVar2 = ppcVar7,
         ppcVar7 ==
         local_48.
         super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
         ._M_impl.super__Vector_impl_data._M_finish)) break;
    }
  }
  if (local_48.
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLocalGenerator::ProcessEvaluationFiles(
    std::vector<std::string>& generatedFiles)
{
  std::vector<cmGeneratorExpressionEvaluationFile*> ef =
      this->Makefile->GetEvaluationFiles();
  for(std::vector<cmGeneratorExpressionEvaluationFile*>::const_iterator
      li = ef.begin();
      li != ef.end();
      ++li)
    {
    (*li)->Generate(this);
    if (cmSystemTools::GetFatalErrorOccured())
      {
      return;
      }
    std::vector<std::string> files = (*li)->GetFiles();
    std::sort(files.begin(), files.end());

    std::vector<std::string> intersection;
    std::set_intersection(files.begin(), files.end(),
                          generatedFiles.begin(), generatedFiles.end(),
                          std::back_inserter(intersection));
    if (!intersection.empty())
      {
      cmSystemTools::Error("Files to be generated by multiple different "
        "commands: ", cmWrap('"', intersection, '"', " ").c_str());
      return;
      }

    generatedFiles.insert(generatedFiles.end(), files.begin(), files.end());
    std::vector<std::string>::iterator newIt =
        generatedFiles.end() - files.size();
    std::inplace_merge(generatedFiles.begin(), newIt, generatedFiles.end());
    }
}